

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O0

void boxcox_eval(double *x,int N,double lambda,double *bxcx)

{
  double dVar1;
  int local_34;
  int i;
  double eps;
  double *bxcx_local;
  double lambda_local;
  int N_local;
  double *x_local;
  
  dVar1 = macheps();
  if (dVar1 / 744.44 <= ABS(lambda)) {
    for (local_34 = 0; local_34 < N; local_34 = local_34 + 1) {
      dVar1 = log(x[local_34]);
      dVar1 = expm1(lambda * dVar1);
      bxcx[local_34] = dVar1 / lambda;
    }
  }
  else {
    for (local_34 = 0; local_34 < N; local_34 = local_34 + 1) {
      dVar1 = log(x[local_34]);
      bxcx[local_34] = dVar1;
    }
  }
  return;
}

Assistant:

void boxcox_eval(double *x, int N, double lambda,double *bxcx) {
    double eps;
    int i;

    eps = macheps() / 744.44;

    if (fabs(lambda) < eps) {
        for(i = 0; i < N;++i) {
            bxcx[i] = log(x[i]);
        }
    } else {
        for(i = 0; i < N;++i) {
            bxcx[i] = expm1(lambda * log(x[i])) / lambda;
        }
    }

}